

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

int Bmc_CollapseExpand(sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
                      Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vNums_00;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  
  if (fCanon == 0) {
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(vLits,fOnOffSetLit);
    }
    vNums_00 = (Vec_Int_t *)(long)nBTLimit;
    iVar4 = sat_solver_solve(pSat,vLits->pArray,vLits->pArray + vLits->nSize,(ABC_INT64_T)vNums_00,0
                             ,0,0);
    if (-1 < fOnOffSetLit) {
      if (vLits->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar5 = vLits->nSize - 1;
      vNums_00 = (Vec_Int_t *)(ulong)uVar5;
      vLits->nSize = uVar5;
    }
    if (iVar4 != -1) {
      if (iVar4 == 0) {
        return -1;
      }
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x1da,
                    "int Bmc_CollapseExpand(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    if (0 < vLits->nSize) {
      piVar2 = (pSat->conf_final).ptr;
      uVar5 = (pSat->conf_final).size;
      vNums_00 = (Vec_Int_t *)(ulong)uVar5;
      piVar3 = vLits->pArray;
      lVar8 = 0;
      do {
        pVVar6 = (Vec_Int_t *)0x0;
        if (0 < (int)uVar5) {
          pVVar6 = (Vec_Int_t *)0x0;
          do {
            uVar1 = piVar2[(long)pVVar6];
            if ((int)uVar1 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            if ((uVar1 ^ piVar3[lVar8]) == 1) goto LAB_00583867;
            pVVar6 = (Vec_Int_t *)((long)&pVVar6->nCap + 1);
          } while (vNums_00 != pVVar6);
          pVVar6 = (Vec_Int_t *)(ulong)uVar5;
        }
LAB_00583867:
        if ((uint)pVVar6 == uVar5) {
          piVar3[lVar8] = -1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vLits->nSize);
    }
    fCanon = 0;
  }
  else {
    vNums_00 = vNums;
    iVar4 = Bmc_CollapseExpandRound(pSat,pSatOn,vLits,vNums,vTemp,nBTLimit,fCanon,-1);
    if (iVar4 == -1) {
      return -1;
    }
    fOnOffSetLit = -1;
  }
  iVar7 = -1;
  iVar4 = Bmc_CollapseExpandRound
                    (pSat,(sat_solver *)0x0,vLits,vNums_00,vTemp,nBTLimit,fCanon,fOnOffSetLit);
  if (iVar4 != -1) {
    vNums->nSize = 0;
    if (0 < vLits->nSize) {
      lVar8 = 0;
      do {
        if (vLits->pArray[lVar8] != -1) {
          Vec_IntPush(vNums,(int)lVar8);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vLits->nSize);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int Bmc_CollapseExpand( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    // perform one quick reduction if it is non-canonical
    if ( !fCanon )
    {
        int i, k, iLit, status, nFinal, * pFinal;
        // check against offset
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vLits, fOnOffSetLit );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPop( vLits );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );
        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        // mark unused literals
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                Vec_IntWriteEntry( vLits, i, -1 );
        }
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, fOnOffSetLit ) == -1 )
            return -1;
    }
    else
    {
        if ( Bmc_CollapseExpandRound( pSat, pSatOn, vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
    }
    {
        // put into new array
        int i, iLit;
        Vec_IntClear( vNums );
        Vec_IntForEachEntry( vLits, iLit, i )
            if ( iLit != -1 )
                Vec_IntPush( vNums, i );
    }
    return 0;
}